

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

void __thiscall
cmSourceFile::AppendProperty(cmSourceFile *this,string *prop,string *value,bool asString)

{
  size_t __n;
  int iVar1;
  cmListFileBacktrace lfbt;
  cmListFileBacktrace cStack_38;
  
  __n = prop->_M_string_length;
  if ((__n == propINCLUDE_DIRECTORIES_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar1 = bcmp((prop->_M_dataplus)._M_p,propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p,__n
                   ), iVar1 == 0)))) {
    if (value->_M_string_length == 0) {
      return;
    }
    cmMakefile::GetBacktrace((this->Location).Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &this->IncludeDirectories,value,&cStack_38);
  }
  else if ((__n == propCOMPILE_OPTIONS_abi_cxx11_._M_string_length) &&
          ((__n == 0 ||
           (iVar1 = bcmp((prop->_M_dataplus)._M_p,propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p,
                         __n), iVar1 == 0)))) {
    if (value->_M_string_length == 0) {
      return;
    }
    cmMakefile::GetBacktrace((this->Location).Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &this->CompileOptions,value,&cStack_38);
  }
  else {
    if ((__n != propCOMPILE_DEFINITIONS_abi_cxx11_._M_string_length) ||
       ((__n != 0 &&
        (iVar1 = bcmp((prop->_M_dataplus)._M_p,propCOMPILE_DEFINITIONS_abi_cxx11_._M_dataplus._M_p,
                      __n), iVar1 != 0)))) {
      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
      return;
    }
    if (value->_M_string_length == 0) {
      return;
    }
    cmMakefile::GetBacktrace((this->Location).Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &this->CompileDefinitions,value,&cStack_38);
  }
  if (cStack_38.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cStack_38.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void cmSourceFile::AppendProperty(const std::string& prop,
                                  const std::string& value, bool asString)
{
  if (prop == propINCLUDE_DIRECTORIES) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->IncludeDirectories.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileOptions.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileDefinitions.emplace_back(value, lfbt);
    }
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}